

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvatiming.c
# Opt level: O0

void time_pcounter_nv40(uint cnum)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint local_10;
  uint32_t debug1;
  int i;
  uint cnum_local;
  
  printf("Perf counters:\n");
  uVar1 = nva_rd32(cnum,0x400084);
  for (local_10 = 0; (int)local_10 < 8; local_10 = local_10 + 1) {
    nva_wr32(cnum,local_10 * 4 + 0xa7c0,1);
    nva_wr32(cnum,local_10 * 4 + 0xa460,0);
    nva_wr32(cnum,local_10 * 4 + 0xa4a0,0);
    nva_wr32(cnum,local_10 * 4 + 0xa4e0,0);
    nva_wr32(cnum,local_10 * 4 + 0xa500,0);
    nva_wr32(cnum,local_10 * 4 + 0xa520,0);
    nva_wr32(cnum,local_10 * 4 + 0xa420,0xffff);
    nva_wr32(cnum,0x400084,uVar1 | 0x20);
    sleep(1);
    nva_wr32(cnum,0x400084,uVar1 | 0x20);
    uVar2 = nva_rd32(cnum,local_10 * 4 + 0xa600);
    printf("Set %d: %u Hz\n",(ulong)local_10,(ulong)uVar2);
  }
  return;
}

Assistant:

void time_pcounter_nv40(unsigned int cnum)
{
	printf ("Perf counters:\n");

	int i;
	uint32_t debug1 = nva_rd32(cnum, 0x400084);
	for (i = 0; i < 8; i++) {
		nva_wr32(cnum, 0xa7c0 + i * 4, 0x1);
		nva_wr32(cnum, 0xa460 + i * 4, 0);
		nva_wr32(cnum, 0xa4a0 + i * 4, 0);
		nva_wr32(cnum, 0xa4e0 + i * 4, 0);
		nva_wr32(cnum, 0xa500 + i * 4, 0);
		nva_wr32(cnum, 0xa520 + i * 4, 0);
		nva_wr32(cnum, 0xa420 + i * 4, 0xffff);
		nva_wr32(cnum, 0x400084, debug1 | 0x20);
		sleep(1);
		nva_wr32(cnum, 0x400084, debug1 | 0x20);
		printf ("Set %d: %u Hz\n", i, nva_rd32(cnum, 0xa600 + i * 4));
	}
}